

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

Error __thiscall
asmjit::StringBuilder::_opString(StringBuilder *this,uint32_t op,char *str,size_t len)

{
  char *__dest;
  size_t in_RCX;
  char *in_RDX;
  uint32_t unaff_retaddr;
  StringBuilder *in_stack_00000008;
  char *p;
  undefined8 local_40;
  undefined8 local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_28 = in_RCX;
  if (in_RCX == 0xffffffffffffffff) {
    if (in_RDX == (char *)0x0) {
      local_40 = 0;
    }
    else {
      local_40 = strlen(in_RDX);
    }
    local_28 = local_40;
  }
  __dest = prepare(in_stack_00000008,unaff_retaddr,
                   CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if (__dest != (char *)0x0) {
    memcpy(__dest,in_RDX,local_28);
  }
  return (uint)(__dest == (char *)0x0);
}

Assistant:

Error StringBuilder::_opString(uint32_t op, const char* str, size_t len) noexcept {
  if (len == Globals::kInvalidIndex)
    len = str ? ::strlen(str) : static_cast<size_t>(0);

  char* p = prepare(op, len);
  if (!p) return DebugUtils::errored(kErrorNoHeapMemory);

  ::memcpy(p, str, len);
  return kErrorOk;
}